

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O0

int nn_req_csend(nn_sockbase *self,nn_msg *msg)

{
  size_t sVar1;
  uint8_t *buf;
  nn_sockbase *local_28;
  nn_req *req;
  nn_msg *msg_local;
  nn_sockbase *self_local;
  
  local_28 = self;
  if (self == (nn_sockbase *)0x0) {
    local_28 = (nn_sockbase *)0x0;
  }
  *(int *)&local_28[0x38].sock = *(int *)&local_28[0x38].sock + 1;
  sVar1 = nn_chunkref_size(&msg->sphdr);
  if (sVar1 == 0) {
    nn_chunkref_term(&msg->sphdr);
    nn_chunkref_init(&msg->sphdr,4);
    buf = (uint8_t *)nn_chunkref_data(&msg->sphdr);
    nn_putl(buf,*(uint *)&local_28[0x38].sock | 0x80000000);
    nn_msg_term((nn_msg *)(local_28 + 0x39));
    nn_msg_mv((nn_msg *)(local_28 + 0x39),msg);
    nn_fsm_action((nn_fsm *)(local_28 + 0x32),4);
    return 0;
  }
  nn_backtrace_print();
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","nn_chunkref_size (&msg->sphdr) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/src/protocols/reqrep/req.c"
          ,0xf0);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

int nn_req_csend (struct nn_sockbase *self, struct nn_msg *msg)
{
    struct nn_req *req;

    req = nn_cont (self, struct nn_req, xreq.sockbase);

    /*  Generate new request ID for the new request and put it into message
        header. The most important bit is set to 1 to indicate that this is
        the bottom of the backtrace stack. */
    ++req->task.id;
    nn_assert (nn_chunkref_size (&msg->sphdr) == 0);
    nn_chunkref_term (&msg->sphdr);
    nn_chunkref_init (&msg->sphdr, 4);
    nn_putl (nn_chunkref_data (&msg->sphdr), req->task.id | 0x80000000);

    /*  Store the message so that it can be re-sent if there's no reply. */
    nn_msg_term (&req->task.request);
    nn_msg_mv (&req->task.request, msg);

    /*  Notify the state machine. */
    nn_fsm_action (&req->fsm, NN_REQ_ACTION_SENT);

    return 0;
}